

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-reader.c
# Opt level: O1

bson_reader_t *
bson_reader_new_from_handle(void *handle,bson_reader_read_func_t rf,bson_reader_destroy_func_t df)

{
  bson_reader_handle_t *reader;
  uint8_t *puVar1;
  bson_reader_t *extraout_RAX;
  bson_reader_t *extraout_RAX_00;
  long lVar2;
  int *piVar3;
  bson_reader_t *pbVar4;
  size_t __nbytes;
  void *__buf;
  int *piVar5;
  
  if (handle == (void *)0x0) {
    bson_reader_new_from_handle_cold_2();
  }
  else if (rf != (bson_reader_read_func_t)0x0) {
    reader = (bson_reader_handle_t *)bson_malloc0(0x180);
    reader->type = BSON_READER_HANDLE;
    puVar1 = (uint8_t *)bson_malloc0(0x400);
    reader->data = puVar1;
    reader->handle = handle;
    reader->len = 0x400;
    reader->offset = 0;
    bson_reader_set_read_func((bson_reader_t *)reader,rf);
    if (df != (bson_reader_destroy_func_t)0x0) {
      bson_reader_set_destroy_func((bson_reader_t *)reader,df);
    }
    _bson_reader_handle_fill_buffer(reader);
    return (bson_reader_t *)reader;
  }
  bson_reader_new_from_handle_cold_1();
  if (*handle == 1) {
    *(bson_reader_read_func_t *)((long)handle + 0x108) = rf;
    return extraout_RAX;
  }
  bson_reader_set_read_func_cold_1();
  if (*handle == 1) {
    *(bson_reader_read_func_t *)((long)handle + 0x110) = rf;
    return extraout_RAX_00;
  }
  bson_reader_set_destroy_func_cold_1();
  if ((((*(byte *)((long)handle + 0x10) & 1) == 0) && (*(long *)((long)handle + 0x28) == 0)) &&
     (*(long *)((long)handle + 0x18) == 0)) {
    pbVar4 = (bson_reader_t *)
             (**(code **)((long)handle + 0x108))
                       (*(undefined8 *)((long)handle + 8),*(undefined8 *)((long)handle + 0x100),
                        *(undefined8 *)((long)handle + 0x20));
    if ((long)pbVar4 < 1) {
      *(byte *)((long)handle + 0x10) = *(byte *)((long)handle + 0x10) | 1;
    }
    else {
      *(long *)((long)handle + 0x30) = (long)&pbVar4->type + *(long *)((long)handle + 0x30);
      *(bson_reader_t **)((long)handle + 0x18) = pbVar4;
    }
    return pbVar4;
  }
  memmove(*(void **)((long)handle + 0x100),
          (void *)((long)*(void **)((long)handle + 0x100) + *(long *)((long)handle + 0x28)),
          *(long *)((long)handle + 0x18) - *(long *)((long)handle + 0x28));
  piVar5 = *(int **)((long)handle + 8);
  lVar2 = *(long *)((long)handle + 0x18) - *(long *)((long)handle + 0x28);
  *(long *)((long)handle + 0x18) = lVar2;
  *(int *)((long)handle + 0x28) = 0;
  *(int *)((long)handle + 0x2c) = 0;
  __buf = (void *)(*(long *)((long)handle + 0x100) + lVar2);
  lVar2 = (**(code **)((long)handle + 0x108))(piVar5,__buf,*(long *)((long)handle + 0x20) - lVar2);
  if (lVar2 < 1) {
    *(byte *)((long)handle + 0x10) =
         ((lVar2 != 0) * '\x02' | *(byte *)((long)handle + 0x10) & 0xfc) + 1;
  }
  else {
    *(long *)((long)handle + 0x30) = *(long *)((long)handle + 0x30) + lVar2;
    *(long *)((long)handle + 0x18) = *(long *)((long)handle + 0x18) + lVar2;
  }
  if (*(long *)((long)handle + 0x28) == 0) {
    if (*(bson_reader_t **)((long)handle + 0x18) <= *(bson_reader_t **)((long)handle + 0x20)) {
      return *(bson_reader_t **)((long)handle + 0x18);
    }
  }
  else {
    _bson_reader_handle_fill_buffer_cold_1();
  }
  _bson_reader_handle_fill_buffer_cold_2();
  if ((int)piVar5 == -1) {
    bson_reader_new_from_fd_cold_1();
    if ((piVar5 != (int *)0x0) && (*piVar5 != -1)) {
      do {
        pbVar4 = (bson_reader_t *)read(*piVar5,__buf,__nbytes);
        if (pbVar4 != (bson_reader_t *)0xffffffffffffffff) {
          return pbVar4;
        }
        piVar3 = __errno_location();
      } while (*piVar3 == 0xb);
    }
    return (bson_reader_t *)0xffffffffffffffff;
  }
  piVar3 = (int *)bson_malloc0(8);
  *piVar3 = (int)piVar5;
  *(char *)(piVar3 + 1) = (char)__buf;
  pbVar4 = bson_reader_new_from_handle
                     (piVar3,_bson_reader_handle_fd_read,_bson_reader_handle_fd_destroy);
  return pbVar4;
}

Assistant:

bson_reader_t *
bson_reader_new_from_handle (void *handle,
                             bson_reader_read_func_t rf,
                             bson_reader_destroy_func_t df)
{
   bson_reader_handle_t *real;

   BSON_ASSERT (handle);
   BSON_ASSERT (rf);

   real = bson_malloc0 (sizeof *real);
   real->type = BSON_READER_HANDLE;
   real->data = bson_malloc0 (1024);
   real->handle = handle;
   real->len = 1024;
   real->offset = 0;

   bson_reader_set_read_func ((bson_reader_t *) real, rf);

   if (df) {
      bson_reader_set_destroy_func ((bson_reader_t *) real, df);
   }

   _bson_reader_handle_fill_buffer (real);

   return (bson_reader_t *) real;
}